

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_176::GUFAOptimizer::visitFunction(GUFAOptimizer *this,Function *func)

{
  Module *pMVar1;
  char cVar2;
  Expression **ppEVar3;
  undefined1 local_310 [8];
  PassRunner runner;
  pointer local_208;
  pointer local_1f8;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e0;
  undefined1 auStack_1a8 [8];
  Adder adder;
  long local_b0 [2];
  char local_a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_98;
  bool local_78;
  string local_70;
  string local_50;
  
  if (this->optimized == true) {
    ReFinalize::ReFinalize((ReFinalize *)local_310);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               &runner.options.ignoreImplicitTraps,&func->body);
    local_310 = (undefined1  [8])&PTR__ReFinalize_01070c30;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1e0);
    if (local_208 != (pointer)0x0) {
      operator_delete(local_208,(long)local_1f8 - (long)local_208);
    }
    Pass::~Pass((Pass *)local_310);
  }
  if ((this->castAll == true) &&
     (pMVar1 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
               ).
               super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .currModule, ((pMVar1->features).features & 0x400) != 0)) {
    auStack_1a8 = (undefined1  [8])0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep = (Expression **)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed._M_elems[9].currp
         = (Expression **)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    adder.parent._0_1_ = '\0';
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.currFunction =
         (Function *)pMVar1;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.currModule = (Module *)this;
    Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::pushTask
              ((Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_> *)auStack_1a8,
               PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::scan,&func->body);
    if (((long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
               super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
               super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
               _M_elems[9].currp >> 4) +
        (long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
              super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep != 0) {
      do {
        if ((pointer)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                     super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                     _M_elems[9].currp ==
            adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
            super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
              super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep ==
              (Expression **)0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,
                          "T &wasm::SmallVector<wasm::Walker<Adder, wasm::UnifiedExpressionVisitor<Adder>>::Task, 10>::back() [T = wasm::Walker<Adder, wasm::UnifiedExpressionVisitor<Adder>>::Task, N = 10]"
                         );
          }
          ppEVar3 = adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                    _M_elems[(long)adder.
                                   super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>
                                   .
                                   super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>
                                   .replacep + -2].currp;
          auStack_1a8 = (undefined1  [8])
                        adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                        super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.
                        fixed._M_elems
                        [(long)adder.
                               super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>
                               .super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                               replacep + -1].func;
          adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
          super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep =
               (Expression **)
               ((long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                      super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep +
               -1);
        }
        else {
          ppEVar3 = (Expression **)
                    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible
                    .
                    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].func;
          auStack_1a8 = (undefined1  [8])
                        adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                        super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.
                        flexible.
                        super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].currp;
          adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
          super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
               super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        if (*(Expression **)auStack_1a8 == (Expression *)0x0) {
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,
                        "void wasm::Walker<Adder, wasm::UnifiedExpressionVisitor<Adder>>::walk(Expression *&) [SubType = Adder, VisitorType = wasm::UnifiedExpressionVisitor<Adder>]"
                       );
        }
        (*(code *)ppEVar3)((Adder *)auStack_1a8,(Expression **)auStack_1a8);
      } while (((long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                      super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                      super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                      _M_elems[9].currp >> 4) +
               (long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                     super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep != 0
              );
    }
    cVar2 = (char)adder.parent;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.currFunction = (Function *)0x0
    ;
    if ((char)adder.parent == '\x01') {
      ReFinalize::ReFinalize((ReFinalize *)local_310);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
                 &runner.options.ignoreImplicitTraps,&func->body);
      local_310 = (undefined1  [8])&PTR__ReFinalize_01070c30;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_1e0);
      if (local_208 != (pointer)0x0) {
        operator_delete(local_208,(long)local_1f8 - (long)local_208);
      }
      Pass::~Pass((Pass *)local_310);
    }
    if (adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
        super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                      super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                      _M_elems[9].currp,
                      (long)adder.
                            super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                            super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)adder.
                            super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                            super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.
                            fixed._M_elems[9].currp);
    }
    if (cVar2 != '\0') {
      this->optimized = true;
    }
  }
  if (this->optimized == true) {
    EHUtils::handleBlockNestedPops
              (func,(this->
                    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                    ).
                    super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                    .currModule,SkipIfNoEH);
    if (this->optimizing == true) {
      PassRunner::PassRunner
                ((PassRunner *)local_310,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                 ).super_Pass.runner);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dce","");
      local_a0 = '\0';
      PassRunner::add((PassRunner *)local_310,&local_70,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&adder.optimized);
      if (local_a0 == '\x01') {
        local_a0 = '\0';
        if ((long *)adder._224_8_ != local_b0) {
          operator_delete((void *)adder._224_8_,local_b0[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"vacuum","");
      local_78 = false;
      PassRunner::add((PassRunner *)local_310,&local_50,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_98);
      if (local_78 == true) {
        local_78 = false;
        if (local_98._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_98._M_value + 0x10)) {
          operator_delete((void *)local_98._M_value._M_dataplus._M_p,local_98._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      PassRunner::runOnFunction((PassRunner *)local_310,func);
      PassRunner::~PassRunner((PassRunner *)local_310);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (optimized) {
      // Optimization may introduce more unreachables, which we need to
      // propagate.
      ReFinalize().walkFunctionInModule(func, getModule());
    }

    // Potentially add new casts after we do our first pass of optimizations +
    // refinalize (doing it after refinalizing lets us add as few new casts as
    // possible).
    if (castAll && addNewCasts(func)) {
      optimized = true;
    }

    if (!optimized) {
      return;
    }

    // We may add blocks around pops, which we must fix up.
    EHUtils::handleBlockNestedPops(func, *getModule());

    // If we are in "optimizing" mode, we'll also run some more passes on this
    // function that we just optimized. If not, leave now.
    if (!optimizing) {
      return;
    }

    PassRunner runner(getPassRunner());
    // New unreachables we added have created dead code we can remove. If we do
    // not do this, then running GUFA repeatedly can actually increase code size
    // (by adding multiple unneeded unreachables).
    runner.add("dce");
    // New drops we added allow us to remove more unused code and values. As
    // with unreachables, without a vacuum we may increase code size as in
    // nested expressions we may apply the same value multiple times:
    //
    //  (block $out
    //   (block $in
    //    (i32.const 10)))
    //
    // In each of the blocks we'll infer the value must be 10, so we'll end up
    // with this repeating code:
    //
    //  (block ;; a new block just to drop the old outer block
    //   (drop
    //    (block $out
    //     (drop
    //      (block $in
    //       (i32.const 10)
    //      )
    //     )
    //     (i32.const 10)
    //    )
    //   )
    //   (i32.const 10)
    //  )
    runner.add("vacuum");
    runner.runOnFunction(func);
  }